

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O0

void __thiscall AbstractModuleClient::initializeStreams(AbstractModuleClient *this)

{
  long in_RDI;
  string *e_1;
  string *e;
  char *in_stack_00000048;
  MlmWrap *in_stack_00000050;
  char *in_stack_00000090;
  char *in_stack_00000098;
  MlmWrap *in_stack_000000a0;
  
  MlmWrap::subscribeStream(in_stack_000000a0,in_stack_00000098,in_stack_00000090);
  MlmWrap::subscribeStream(in_stack_000000a0,in_stack_00000098,in_stack_00000090);
  std::__cxx11::string::c_str();
  MlmWrap::setProducer(in_stack_00000050,in_stack_00000048);
  *(undefined8 *)(in_RDI + 0x158) = 0;
  return;
}

Assistant:

void AbstractModuleClient::initializeStreams(){
    //set the module as a subscriber to the general trodes commands stream
    try{
        this->subscribeStream(TRODES_NETWORK_ID, TRODES_CMD);
        this->subscribeStream(TRODES_NETWORK_ID, TRODES_NETWORK_NOTIFICATION);
    } catch(std::string &e){
        std::cout << e << std::endl;
    }

    //initialize module data stream
    try{
        this->setProducer(this->id.c_str());
    } catch(std::string &e){
        std::cout << e << std::endl;
    }
    timestampsub = NULL;
}